

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

Vec_Ptr_t * Ver_ParseCollectUndefBoxes(Ver_Man_t *pMan)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  uint *puVar7;
  void *pvVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Abc_Des_t *pAVar12;
  long lVar13;
  int iVar14;
  uint *puVar15;
  Vec_Ptr_t *pVVar16;
  ulong local_60;
  
  pAVar12 = pMan->pDesign;
  pVVar16 = pAVar12->vModules;
  iVar14 = pVVar16->nSize;
  if (0 < (long)iVar14) {
    ppvVar5 = pVVar16->pArray;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)ppvVar5[lVar11] + 0x158) = 0;
      lVar11 = lVar11 + 1;
    } while (iVar14 != lVar11);
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(0x80);
  pVVar4->pArray = ppvVar5;
  if (0 < iVar14) {
    iVar14 = 0;
    local_60 = 0x10;
    lVar11 = 0;
    do {
      pvVar2 = pVVar16->pArray[lVar11];
      lVar9 = *(long *)((long)pvVar2 + 0x50);
      if (0 < *(int *)(lVar9 + 4)) {
        lVar13 = 0;
        do {
          lVar3 = *(long *)(*(long *)(lVar9 + 8) + lVar13 * 8);
          if (((*(uint *)(lVar3 + 0x14) & 0xf) == 10) &&
             (pvVar6 = *(void **)(lVar3 + 0x38), pvVar6 != (void *)0x0)) {
            if (*(long *)((long)pvVar6 + 8) == 0) {
              __assert_fail("pNtkBox->pName",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                            ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
            }
            if ((*(int *)(*(long *)((long)pvVar6 + 0x28) + 4) == 0) &&
               (*(int *)(*(long *)((long)pvVar6 + 0x30) + 4) == 0)) {
              puVar7 = *(uint **)((long)pvVar6 + 0x158);
              if (puVar7 == (uint *)0x0) {
                iVar10 = (int)local_60;
                if (iVar14 == iVar10) {
                  if (iVar10 < 0x10) {
                    if (pVVar4->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                    }
                    pVVar4->pArray = ppvVar5;
                    pVVar4->nCap = 0x10;
                    local_60 = 0x10;
                  }
                  else {
                    local_60 = (ulong)(uint)(iVar10 * 2);
                    if (pVVar4->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc(local_60 * 8);
                    }
                    else {
                      ppvVar5 = (void **)realloc(pVVar4->pArray,local_60 * 8);
                    }
                    pVVar4->pArray = ppvVar5;
                    pVVar4->nCap = iVar10 * 2;
                  }
                }
                else {
                  ppvVar5 = pVVar4->pArray;
                }
                iVar10 = iVar14 + 1;
                pVVar4->nSize = iVar10;
                ppvVar5[iVar14] = pvVar6;
                puVar7 = (uint *)malloc(0x10);
                puVar15 = puVar7 + 1;
                puVar7[0] = 0x10;
                puVar7[1] = 0;
                pvVar8 = malloc(0x80);
                *(void **)(puVar7 + 2) = pvVar8;
                *(uint **)((long)pvVar6 + 0x158) = puVar7;
LAB_002ec528:
                pvVar6 = *(void **)(puVar7 + 2);
                iVar14 = iVar10;
              }
              else {
                puVar15 = puVar7 + 1;
                uVar1 = *puVar7;
                iVar10 = iVar14;
                if (puVar7[1] != uVar1) goto LAB_002ec528;
                if ((int)uVar1 < 0x10) {
                  if (*(void **)(puVar7 + 2) == (void *)0x0) {
                    pvVar6 = malloc(0x80);
                  }
                  else {
                    pvVar6 = realloc(*(void **)(puVar7 + 2),0x80);
                  }
                  *(void **)(puVar7 + 2) = pvVar6;
                  *puVar7 = 0x10;
                }
                else {
                  if (*(void **)(puVar7 + 2) == (void *)0x0) {
                    pvVar6 = malloc((ulong)uVar1 << 4);
                  }
                  else {
                    pvVar6 = realloc(*(void **)(puVar7 + 2),(ulong)uVar1 << 4);
                  }
                  *(void **)(puVar7 + 2) = pvVar6;
                  *puVar7 = uVar1 * 2;
                }
              }
              uVar1 = *puVar15;
              *puVar15 = uVar1 + 1;
              *(long *)((long)pvVar6 + (long)(int)uVar1 * 8) = lVar3;
              lVar9 = *(long *)((long)pvVar2 + 0x50);
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(lVar9 + 4));
        pAVar12 = pMan->pDesign;
      }
      lVar11 = lVar11 + 1;
      pVVar16 = pAVar12->vModules;
    } while (lVar11 < pVVar16->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Ver_ParseCollectUndefBoxes( Ver_Man_t * pMan )
{
    Vec_Ptr_t * vUndefs;
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    int i, k;
    // clear the module structures
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->pData = NULL;
    // go through all the blackboxes
    vUndefs = Vec_PtrAlloc( 16 );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
        {
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            if ( Ver_NtkIsDefined(pNtkBox) )
                continue;
            if ( pNtkBox->pData == NULL )
            {
                // save the box
                Vec_PtrPush( vUndefs, pNtkBox );
                pNtkBox->pData = Vec_PtrAlloc( 16 );
            }
            // save the instance
            Vec_PtrPush( (Vec_Ptr_t *)pNtkBox->pData, pBox );
        }
    }
    return vUndefs;
}